

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall pfederc::TypeExpr::~TypeExpr(TypeExpr *this)

{
  ~TypeExpr(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TypeExpr::~TypeExpr() {
}